

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::GetSystemInformation
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  string *str;
  ostream *poVar7;
  char *pcVar8;
  FILE *__stream;
  size_t sVar9;
  string_view str_00;
  size_t *local_1458;
  char *c;
  size_t n;
  char buffer [4096];
  int bufferSize;
  FILE *fin;
  undefined1 local_428 [4];
  int res;
  undefined1 local_408 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args2;
  cmWorkingDirectory workdir;
  cmAlphaNum local_398;
  string local_368;
  Status local_348;
  cmAlphaNum local_340;
  cmAlphaNum local_310;
  undefined1 local_2e0 [8];
  string outFile;
  cmAlphaNum local_290;
  undefined1 local_260 [8];
  string inFile;
  cmAlphaNum local_210;
  undefined1 local_1e0 [8];
  string modulesPath;
  cmAlphaNum local_190;
  string local_160;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_108;
  undefined1 local_e8 [8];
  string value;
  string *arg;
  uint i;
  bool writeToStdout;
  undefined8 uStack_a0;
  Status local_98;
  undefined1 local_90 [8];
  string destPath;
  undefined1 local_60 [8];
  string cwd;
  string resultFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cwd.field_2._M_local_buf + 8));
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "/__cmake_systeminformation");
  local_98 = cmsys::SystemTools::RemoveADirectory((string *)local_90);
  uStack_a0 = cmsys::SystemTools::MakeDirectory((string *)local_90,(mode_t *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool((Status *)&stack0xffffffffffffff60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = true;
    for (arg._4_4_ = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args), arg._4_4_ < sVar4; arg._4_4_ = arg._4_4_ + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)arg._4_4_);
      str_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar5);
      value.field_2._8_8_ = str_00._M_len;
      bVar2 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0xd3ddbf);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)local_e8,(ulong)pvVar5);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
LAB_00525e95:
          CreateGlobalGenerator((cmake *)local_118,(string *)this,SUB81(local_e8,0));
          bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_118);
          if (bVar2) {
            std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
                      (&local_140,
                       (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                       local_118);
            SetGlobalGenerator(this,&local_140);
            std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                      (&local_140);
          }
          else {
            std::operator+(&local_138,"Could not create named generator ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e8);
            cmSystemTools::Error(&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            PrintGeneratorList(this);
          }
          std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                    ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                     local_118);
          bVar2 = false;
        }
        else {
          arg._4_4_ = arg._4_4_ + 1;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (arg._4_4_ < sVar4) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)arg._4_4_);
            std::__cxx11::string::operator=((string *)local_e8,(string *)pvVar5);
            goto LAB_00525e95;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_108,"No generator specified for -G",
                     (allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          cmSystemTools::Error(&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gen._M_t.
                             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                             .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
          PrintGeneratorList(this);
          this_local._4_4_ = -1;
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)local_e8);
        if (bVar2) goto LAB_005266f0;
      }
      else {
        bVar1 = cmsys::SystemTools::FileIsFullPath(pvVar5);
        if (!bVar1) {
          cmAlphaNum::cmAlphaNum(&local_190,(string *)local_60);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&modulesPath.field_2 + 8),'/');
          cmStrCat<>(&local_160,&local_190,(cmAlphaNum *)((long)&modulesPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(cwd.field_2._M_local_buf + 8),(string *)&local_160);
          std::__cxx11::string::~string((string *)&local_160);
        }
        std::__cxx11::string::operator+=((string *)(cwd.field_2._M_local_buf + 8),(string *)pvVar5);
        bVar1 = false;
      }
    }
    AddCMakePaths(this);
    str = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmAlphaNum::cmAlphaNum(&local_210,str);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&inFile.field_2 + 8),"/Modules");
    cmStrCat<>((string *)local_1e0,&local_210,(cmAlphaNum *)((long)&inFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_290,(string *)local_1e0);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&outFile.field_2 + 8),"/SystemInformation.cmake");
    cmStrCat<>((string *)local_260,&local_290,(cmAlphaNum *)((long)&outFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_310,(string *)local_90);
    cmAlphaNum::cmAlphaNum(&local_340,"/CMakeLists.txt");
    cmStrCat<>((string *)local_2e0,&local_310,&local_340);
    local_348 = cmsys::SystemTools::CopyFileAlways((string *)local_260,(string *)local_2e0);
    bVar2 = cmsys::Status::operator_cast_to_bool(&local_348);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_398,(string *)local_60);
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)&workdir.ResultCode,"/__cmake_systeminformation/results.txt");
        cmStrCat<>(&local_368,&local_398,(cmAlphaNum *)&workdir.ResultCode);
        std::__cxx11::string::operator=
                  ((string *)(cwd.field_2._M_local_buf + 8),(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
      }
      cmWorkingDirectory::cmWorkingDirectory
                ((cmWorkingDirectory *)
                 &args2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_90);
      bVar2 = cmWorkingDirectory::Failed
                        ((cmWorkingDirectory *)
                         &args2.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to change to directory ");
        poVar7 = std::operator<<(poVar7,(string *)local_90);
        poVar7 = std::operator<<(poVar7," : ");
        iVar3 = cmWorkingDirectory::GetLastResult
                          ((cmWorkingDirectory *)
                           &args2.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar8 = strerror(iVar3);
        poVar7 = std::operator<<(poVar7,pcVar8);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = 1;
        bVar2 = true;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_408,pvVar5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_408,(value_type *)local_90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_428,"-DRESULT_FILE=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cwd.field_2 + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_408,(value_type *)local_428);
        std::__cxx11::string::~string((string *)local_428);
        iVar3 = Run(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_408,false);
        bVar2 = iVar3 != 0;
        if (bVar2) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: --system-information failed on internal CMake!\n");
          this_local._4_4_ = iVar3;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_408);
      }
      cmWorkingDirectory::~cmWorkingDirectory
                ((cmWorkingDirectory *)
                 &args2.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar2) {
        if ((bVar1) &&
           (__stream = (FILE *)cmsys::SystemTools::Fopen((string *)((long)&cwd.field_2 + 8),"r"),
           __stream != (FILE *)0x0)) {
          while (sVar9 = fread(&n,1,0x1000,__stream), sVar9 != 0) {
            for (local_1458 = &n; local_1458 < buffer + (sVar9 - 8);
                local_1458 = (size_t *)((long)local_1458 + 1)) {
              putc((int)(char)*local_1458,_stdout);
            }
            fflush(_stdout);
          }
          fclose(__stream);
        }
        cmsys::SystemTools::RemoveADirectory((string *)local_90);
        this_local._4_4_ = 0;
      }
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Error copying file \"");
      poVar7 = std::operator<<(poVar7,(string *)local_260);
      poVar7 = std::operator<<(poVar7,"\" to \"");
      poVar7 = std::operator<<(poVar7,(string *)local_2e0);
      std::operator<<(poVar7,"\".\n");
      this_local._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)local_1e0);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Error: --system-information must be run from a writable directory!\n");
    this_local._4_4_ = 1;
  }
LAB_005266f0:
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(cwd.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmake::GetSystemInformation(std::vector<std::string>& args)
{
  // so create the directory
  std::string resultFile;
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  std::string destPath = cwd + "/__cmake_systeminformation";
  cmSystemTools::RemoveADirectory(destPath);
  if (!cmSystemTools::MakeDirectory(destPath)) {
    std::cerr << "Error: --system-information must be run from a "
                 "writable directory!\n";
    return 1;
  }

  // process the arguments
  bool writeToStdout = true;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (cmHasLiteralPrefix(arg, "-G")) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return -1;
        }
        value = args[i];
      }
      auto gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator " + value);
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(std::move(gen));
      }
    }
    // no option assume it is the output file
    else {
      if (!cmSystemTools::FileIsFullPath(arg)) {
        resultFile = cmStrCat(cwd, '/');
      }
      resultFile += arg;
      writeToStdout = false;
    }
  }

  // we have to find the module directory, so we can copy the files
  this->AddCMakePaths();
  std::string modulesPath =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules");
  std::string inFile = cmStrCat(modulesPath, "/SystemInformation.cmake");
  std::string outFile = cmStrCat(destPath, "/CMakeLists.txt");

  // Copy file
  if (!cmsys::SystemTools::CopyFileAlways(inFile, outFile)) {
    std::cerr << "Error copying file \"" << inFile << "\" to \"" << outFile
              << "\".\n";
    return 1;
  }

  // do we write to a file or to stdout?
  if (resultFile.empty()) {
    resultFile = cmStrCat(cwd, "/__cmake_systeminformation/results.txt");
  }

  {
    // now run cmake on the CMakeLists file
    cmWorkingDirectory workdir(destPath);
    if (workdir.Failed()) {
      // We created the directory and we were able to copy the CMakeLists.txt
      // file to it, so we wouldn't expect to get here unless the default
      // permissions are questionable or some other process has deleted the
      // directory
      std::cerr << "Failed to change to directory " << destPath << " : "
                << std::strerror(workdir.GetLastResult()) << std::endl;
      return 1;
    }
    std::vector<std::string> args2;
    args2.push_back(args[0]);
    args2.push_back(destPath);
    args2.push_back("-DRESULT_FILE=" + resultFile);
    int res = this->Run(args2, false);

    if (res != 0) {
      std::cerr << "Error: --system-information failed on internal CMake!\n";
      return res;
    }
  }

  // echo results to stdout if needed
  if (writeToStdout) {
    FILE* fin = cmsys::SystemTools::Fopen(resultFile, "r");
    if (fin) {
      const int bufferSize = 4096;
      char buffer[bufferSize];
      size_t n;
      while ((n = fread(buffer, 1, bufferSize, fin)) > 0) {
        for (char* c = buffer; c < buffer + n; ++c) {
          putc(*c, stdout);
        }
        fflush(stdout);
      }
      fclose(fin);
    }
  }

  // clean up the directory
  cmSystemTools::RemoveADirectory(destPath);
  return 0;
}